

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameForDecPOMDPStage.cpp
# Opt level: O2

void __thiscall
BayesianGameForDecPOMDPStage::ComputeAllImmediateRewards
          (BayesianGameForDecPOMDPStage *this,FactoredDecPOMDPDiscreteInterface *fd)

{
  size_t __n;
  size_t __n_00;
  ulong __n_01;
  reference this_00;
  reference pvVar1;
  uint jtI;
  allocator_type local_72;
  allocator_type local_71;
  value_type local_70;
  value_type_conflict3 local_68;
  _Vector_base<double,_std::allocator<double>_> local_60;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_48;
  
  if (this->_m_areCachedImmediateRewards == true) {
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::clear(&this->_m_immR);
  }
  __n = BayesianGameBase::GetNrJointTypes
                  ((BayesianGameBase *)&this->super_BayesianGameIdenticalPayoff);
  __n_00 = BayesianGameBase::GetNrJointActions
                     ((BayesianGameBase *)&this->super_BayesianGameIdenticalPayoff);
  local_68 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_60,__n_00,&local_68,&local_71);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_48,__n,(value_type *)&local_60,&local_72);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::_M_move_assign(&this->_m_immR,&local_48);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_48);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_60);
  for (jtI = 0; jtI < __n; jtI = jtI + 1) {
    for (__n_01 = 0; __n_01 < __n_00; __n_01 = (ulong)((Index)__n_01 + 1)) {
      local_70 = ComputeImmediateReward(this,jtI,(Index)__n_01);
      this_00 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::at(&this->_m_immR,(ulong)jtI);
      pvVar1 = std::vector<double,_std::allocator<double>_>::at(this_00,__n_01);
      *pvVar1 = local_70;
    }
  }
  this->_m_areCachedImmediateRewards = true;
  return;
}

Assistant:

void BayesianGameForDecPOMDPStage::
ComputeAllImmediateRewards(const FactoredDecPOMDPDiscreteInterface *fd)
{
    if(_m_areCachedImmediateRewards)
        _m_immR.clear();

    size_t nrJT = GetNrJointTypes();
    size_t nrJA = GetNrJointActions();
    _m_immR = vector< vector <double> >(nrJT, vector<double>(nrJA, 0.0) );

    for(Index jtI=0; jtI< nrJT; jtI++)
        for(Index jaI=0; jaI< nrJA; jaI++)
            _m_immR.at(jtI).at(jaI) = ComputeImmediateReward(jtI, jaI);

    _m_areCachedImmediateRewards = true;
}